

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafill.c
# Opt level: O3

int main(int argc,char **argv)

{
  nva_card **ppnVar1;
  int iVar2;
  int32_t b;
  int32_t v;
  int cnum;
  int32_t a;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar2 = nva_init();
  if (iVar2 == 0) {
    local_38 = 0;
    do {
      while (iVar2 = getopt(argc,argv,"c:"), iVar2 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_38);
      }
    } while (iVar2 != -1);
    if (local_38 < nva_cardsnum) {
      local_40 = 4;
      local_3c = 0;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&local_34);
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&local_40);
        }
        if (_optind + 2 < argc) {
          __isoc99_sscanf(argv[_optind + 2],"%x",&local_3c);
        }
        ppnVar1 = nva_cards;
        if (0 < local_40) {
          iVar2 = 0;
          do {
            *(int *)((long)ppnVar1[local_38]->bar0 + (ulong)(uint)(local_34 + iVar2)) =
                 local_3c + iVar2;
            iVar2 = iVar2 + 4;
          } while (iVar2 < local_40);
          return 0;
        }
        return 0;
      }
      main_cold_4();
    }
    else if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, v = 0, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	if (optind + 2 < argc)
		sscanf (argv[optind + 2], "%x", &v);
	for (i = 0; i < b; i += 4) {
		nva_wr32(cnum, a+i, v+i);
	}
	return 0;
}